

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.cpp
# Opt level: O2

void __thiscall
sjtu::UserManager::query_order(UserManager *this,OrderManager *order_manager,int argc,string *argv)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar3;
  undefined4 extraout_var_00;
  char *pcVar4;
  hashType *phVar5;
  pair<long,_bool> pVar6;
  hashType local_88;
  long local_80;
  char local_78;
  string local_70;
  string uname;
  long lVar2;
  
  std::__cxx11::string::string((string *)&uname,(string *)(argv + 1));
  this_00 = this->UserBpTree;
  std::__cxx11::string::string((string *)&local_70,(string *)&uname);
  local_88 = StringHasher::operator()((StringHasher *)this,&local_70);
  pVar6 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    (this_00,&local_88);
  local_80 = pVar6.first;
  local_78 = pVar6.second;
  std::__cxx11::string::~string((string *)&local_70);
  if (local_78 == '\0') {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    iVar1 = (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[2])
                      (this->UserFile,&local_80);
    lVar2 = CONCAT44(extraout_var,iVar1);
    if (*(uint *)(lVar2 + 0x6c) == this->online_flag) {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(int *)(lVar2 + 0x80));
      std::endl<char,std::char_traits<char>>(poVar3);
      phVar5 = (hashType *)(lVar2 + 0x70);
      while (local_88 = *phVar5, local_88 != 0xffffffffffffffff) {
        iVar1 = (*(order_manager->OrderFile->
                  super_FileManager_Base<std::pair<sjtu::orderType,_long>_>)._vptr_FileManager_Base
                  [2])(order_manager->OrderFile,&local_88);
        lVar2 = CONCAT44(extraout_var_00,iVar1);
        poVar3 = std::operator<<((ostream *)&std::cout,'[');
        pcVar4 = "refunded";
        if (*(int *)(lVar2 + 0xa8) == 1) {
          pcVar4 = "pending";
        }
        if (*(int *)(lVar2 + 0xa8) == 0) {
          pcVar4 = "success";
        }
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,"] ");
        poVar3 = std::operator<<(poVar3,(char *)(lVar2 + 0x15));
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = std::operator<<(poVar3,(char *)(lVar2 + 0x4c));
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = operator<<(poVar3,(timeType *)(lVar2 + 0x2c));
        poVar3 = std::operator<<(poVar3," -> ");
        poVar3 = std::operator<<(poVar3,(char *)(lVar2 + 0x75));
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = operator<<(poVar3,(timeType *)(lVar2 + 0x3c));
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,*(int *)(lVar2 + 0xa4));
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,*(int *)(lVar2 + 0xa0));
        std::endl<char,std::char_traits<char>>(poVar3);
        phVar5 = (hashType *)(lVar2 + 0xb8);
      }
    }
    else {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,-1);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  std::__cxx11::string::~string((string *)&uname);
  return;
}

Assistant:

void UserManager::query_order(OrderManager *order_manager, int argc, std::string *argv) {
            std::string uname = argv[1];
            std::pair<locType, bool> tmp = UserBpTree->find(hasher(uname));
            if (tmp.second == false) std::cout << -1 << std::endl;
            else {
                userType *cur = UserFile->read(tmp.first);
                if (cur->is_online != online_flag) std::cout << -1 << std::endl;
                else {
                    std::cout << cur->order_count << std::endl;
                    locType tmpticket = cur->head;
                    while (tmpticket != -1) {
                        auto ret = order_manager->OrderFile->read(tmpticket);
                        std::cout << '[' << (ret -> first.status ? (ret -> first.status == pending ? "pending" : "refunded") : "success" ) << "] " << ret->first.trainID << ' ' << ret->first.station[0] << ' ' << ret->first.date[0] << " -> " << ret->first.station[1] << ' ' << ret->first.date[1] << ' ' << ret->first.price << ' ' << ret->first.num << std::endl;
                        tmpticket = ret -> second;
                    }
                }
            }
        }